

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArrayMethods.cpp
# Opt level: O0

Type * __thiscall
slang::ast::builtins::ArrayReductionMethod::checkArguments
          (ArrayReductionMethod *this,ASTContext *context,Args *args,SourceRange range,
          Expression *iterExpr)

{
  SourceRange sourceRange;
  SourceRange sourceRange_00;
  SourceRange callRange;
  bool bVar1;
  Compilation *this_00;
  reference ppEVar2;
  SourceLocation in_RCX;
  ASTContext *in_RDX;
  SystemSubroutine *in_RSI;
  SourceLocation in_RDI;
  long in_R9;
  size_t unaff_retaddr;
  size_t in_stack_00000008;
  Type *elemType;
  Compilation *comp;
  string *arg;
  Diagnostic *this_01;
  Type *in_stack_ffffffffffffff68;
  ASTContext *in_stack_ffffffffffffff78;
  undefined8 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 uVar3;
  undefined8 in_stack_ffffffffffffff90;
  DiagCode code;
  Type *local_8;
  
  code = SUB84((ulong)in_stack_ffffffffffffff90 >> 0x20,0);
  this_00 = ASTContext::getCompilation((ASTContext *)0x909b2b);
  arg = (string *)0x0;
  this_01 = (Diagnostic *)0x0;
  callRange.endLoc = in_RCX;
  callRange.startLoc = in_RDI;
  bVar1 = SystemSubroutine::checkArgCount
                    (in_RSI,in_RDX,SUB81((ulong)in_R9 >> 0x38,0),(Args *)this_00,callRange,
                     unaff_retaddr,in_stack_00000008);
  if (bVar1) {
    if (in_R9 == 0) {
      std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)in_RDX,0);
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x909c5d)
      ;
      local_8 = Type::getArrayElementType(in_stack_ffffffffffffff68);
      bVar1 = Type::isIntegral((Type *)this_01);
      if (!bVar1) {
        uVar3 = 0x2000b;
        ppEVar2 = std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::operator[]
                            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
                             in_RDX,0);
        sourceRange_00.endLoc._0_4_ = in_stack_ffffffffffffff88;
        sourceRange_00.startLoc = ((*ppEVar2)->sourceRange).endLoc;
        sourceRange_00.endLoc._4_4_ = uVar3;
        ASTContext::addDiag((ASTContext *)((*ppEVar2)->sourceRange).startLoc,
                            SUB84((ulong)local_8 >> 0x20,0),sourceRange_00);
        Diagnostic::operator<<(this_01,arg);
        local_8 = Compilation::getErrorType(this_00);
      }
    }
    else {
      not_null<const_slang::ast::Type_*>::operator->((not_null<const_slang::ast::Type_*> *)0x909bb8)
      ;
      bVar1 = Type::isIntegral((Type *)this_01);
      if (bVar1) {
        local_8 = not_null<const_slang::ast::Type_*>::operator*
                            ((not_null<const_slang::ast::Type_*> *)0x909c36);
      }
      else {
        sourceRange.endLoc._0_4_ = in_stack_ffffffffffffff88;
        sourceRange.startLoc = (SourceLocation)in_stack_ffffffffffffff80;
        sourceRange.endLoc._4_4_ = in_stack_ffffffffffffff8c;
        ASTContext::addDiag(in_stack_ffffffffffffff78,code,sourceRange);
        Diagnostic::operator<<(this_01,arg);
        local_8 = Compilation::getErrorType(this_00);
      }
    }
  }
  else {
    local_8 = Compilation::getErrorType(this_00);
  }
  return local_8;
}

Assistant:

const Type& checkArguments(const ASTContext& context, const Args& args, SourceRange range,
                               const Expression* iterExpr) const final {
        auto& comp = context.getCompilation();
        if (!checkArgCount(context, true, args, range, 0, 0))
            return comp.getErrorType();

        if (iterExpr) {
            if (!iterExpr->type->isIntegral()) {
                context.addDiag(diag::ArrayMethodIntegral, iterExpr->sourceRange) << name;
                return comp.getErrorType();
            }

            return *iterExpr->type;
        }
        else {
            auto elemType = args[0]->type->getArrayElementType();
            SLANG_ASSERT(elemType);

            if (!elemType->isIntegral()) {
                context.addDiag(diag::ArrayMethodIntegral, args[0]->sourceRange) << name;
                return comp.getErrorType();
            }

            return *elemType;
        }
    }